

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  string *psVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  size_type *psVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  int iVar16;
  undefined1 local_1010 [8];
  ToolOptions options;
  ofstream dst;
  long local_e98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_e90 [14];
  ios_base local_db0 [592];
  undefined1 local_b60 [8];
  ProgramResult result;
  size_type **local_9d8;
  undefined8 local_9d0;
  code *local_9c8;
  code *local_9c0;
  string *local_9b8;
  undefined8 local_9b0;
  code *local_9a8;
  code *local_9a0;
  bool *local_998;
  undefined8 local_990;
  code *local_988;
  code *local_980;
  bool *local_978;
  undefined8 local_970;
  code *local_968;
  code *local_960;
  bool *local_958;
  undefined8 local_950;
  code *local_948;
  code *local_940;
  bool *local_938;
  undefined8 local_930;
  code *local_928;
  code *local_920;
  char *local_918;
  undefined8 local_910;
  code *local_908;
  code *local_900;
  size_type **local_8f8;
  undefined8 local_8f0;
  code *local_8e8;
  code *local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  code *local_8c8;
  code *local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  code *local_8a8;
  code *local_8a0;
  long *local_898 [2];
  long local_888 [2];
  long *local_878 [2];
  long local_868 [2];
  long *local_858 [2];
  long local_848 [2];
  long *local_838 [2];
  long local_828 [2];
  long *local_818 [2];
  long local_808 [2];
  long *local_7f8 [2];
  long local_7e8 [2];
  string local_7d8;
  string local_7b8;
  string local_798;
  long *local_778 [2];
  long local_768 [2];
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  long *local_6b8 [2];
  long local_6a8 [2];
  long *local_698 [2];
  long local_688 [2];
  long *local_678 [2];
  long local_668 [2];
  long *local_658 [2];
  long local_648 [2];
  long *local_638 [2];
  long local_628 [2];
  long *local_618 [2];
  long local_608 [2];
  char *local_5f8;
  string binDir;
  long *local_5d0 [2];
  long local_5c0 [2];
  long *local_5b0 [2];
  long local_5a0 [2];
  long *local_590 [2];
  long local_580 [2];
  long *local_570 [2];
  long local_560 [2];
  long *local_550 [2];
  long local_540 [2];
  long *local_530 [2];
  long local_520 [2];
  long *local_510 [2];
  long local_500 [2];
  long *local_4f0 [2];
  long local_4e0 [2];
  long *local_4d0 [2];
  long local_4c0 [2];
  long *local_4b0 [2];
  long local_4a0 [2];
  long *local_490 [2];
  long local_480 [2];
  long *local_470 [2];
  long local_460 [2];
  long *local_450 [2];
  long local_440 [2];
  long *local_430 [2];
  long local_420 [2];
  long *local_410 [2];
  long local_400 [2];
  long *local_3f0 [2];
  long local_3e0 [2];
  long *local_3d0 [2];
  long local_3c0 [2];
  long *local_3b0 [2];
  long local_3a0 [2];
  long *local_390 [2];
  long local_380 [2];
  long *local_370 [2];
  long local_360 [2];
  long *local_350 [2];
  long local_340 [2];
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  string local_2f0;
  long *local_2d0 [2];
  long local_2c0 [2];
  size_type *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  string local_248;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  code **local_1c8;
  undefined8 local_1c0;
  code *local_1b8;
  code *local_1b0;
  undefined1 local_1a8 [8];
  ProgramResult resultOnInvalid;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  long local_168 [2];
  size_type *local_158;
  string input;
  ProgramResult resultOnValid;
  string command;
  string WasmReduceOption;
  string test;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  size_type *local_88;
  string working;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  char **local_48;
  ulong local_40;
  bool local_35;
  bool local_34;
  bool local_33;
  char local_32;
  bool local_31 [4];
  bool deNan;
  bool verbose;
  bool debugInfo;
  bool force;
  bool binary;
  
  local_158 = &input._M_string_length;
  input._M_dataplus._M_p = (pointer)0x0;
  input._M_string_length._0_1_ = 0;
  WasmReduceOption.field_2._8_8_ = &test._M_string_length;
  test._M_dataplus._M_p = (pointer)0x0;
  test._M_string_length._0_1_ = 0;
  local_88 = &working._M_string_length;
  working._M_dataplus._M_p = (pointer)0x0;
  working._M_string_length._0_1_ = 0;
  resultOnValid.time = (double)&command._M_string_length;
  command._M_dataplus._M_p = (pointer)0x0;
  command._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,*argv,(allocator<char> *)local_b60);
  wasm::Path::getDirName((string *)&local_5f8);
  if ((long *)options._352_8_ != &local_e98) {
    operator_delete((void *)options._352_8_,local_e98 + 1);
  }
  local_31[0] = true;
  local_35 = false;
  local_34 = false;
  local_33 = false;
  local_32 = '\0';
  command.field_2._8_8_ = &WasmReduceOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&command.field_2 + 8),"wasm-reduce options","");
  options._352_8_ = &local_e98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,"wasm-reduce","");
  psVar1 = &result.output;
  local_b60 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b60,
             "Reduce a wasm file to a smaller one that has the same behavior on a given command","")
  ;
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1010,(string *)&options.enabledFeatures,(string *)local_b60);
  if (local_b60 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_b60,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._352_8_ != &local_e98) {
    operator_delete((void *)options._352_8_,local_e98 + 1);
  }
  options._352_8_ = &local_e98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--command","")
  ;
  local_b60 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"-cmd","");
  local_40 = CONCAT44(local_40._4_4_,argc);
  local_2b0 = &cmd._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,"");
  resultOnInvalid.code = 0;
  resultOnInvalid._4_4_ = 0;
  local_1a8 = (undefined1  [8])&resultOnValid.time;
  resultOnInvalid.output._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1207:10)>
       ::_M_invoke;
  resultOnInvalid.output._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1207:10)>
                ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add((string *)local_1010,(string *)&options.enabledFeatures,
                              (string *)local_b60,(string *)&local_2b0,(int)&command + 0x18,
                              (function *)0x1,SUB81(local_1a8,0));
  input.field_2._8_8_ = &resultOnValid.output;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&input.field_2 + 8),"--test","");
  working.field_2._8_8_ = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&working.field_2 + 8),"-t","");
  test.field_2._8_8_ = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&test.field_2 + 8),
             "Test file (this will be written to to test, the given command should read it when we call it)"
             ,"");
  local_1c0 = 0;
  local_1c8 = (code **)((long)&WasmReduceOption.field_2 + 8);
  local_1b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1214:10)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1214:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)(input.field_2._M_local_buf + 8),
                              (string *)(working.field_2._M_local_buf + 8),
                              (string *)(test.field_2._M_local_buf + 8),(int)&command + 0x18,
                              (function *)0x1,SUB81(&local_1c8,0));
  resultOnInvalid.time = (double)local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&resultOnInvalid.time,"--working","");
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"-w","");
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5b0,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,"");
  local_9d0 = 0;
  local_9d8 = &local_88;
  local_9c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1222:10)>
              ::_M_invoke;
  local_9c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1222:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)&resultOnInvalid.time,(string *)local_5d0,
                              (string *)local_5b0,(int)&command + 0x18,(function *)0x1,
                              SUB81(&local_9d8,0));
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"--binaries","");
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"-b","");
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_550,"binaryen binaries location (bin/ directory)","");
  local_9b0 = 0;
  local_9a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1228:10)>
              ::_M_invoke;
  local_9a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1228:10)>
              ::_M_manager;
  local_9b8 = (string *)&local_5f8;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_590,(string *)local_570,(string *)local_550,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_9b8,0));
  local_530[0] = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"--text","");
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"-S","");
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,"");
  local_990 = 0;
  local_998 = local_31;
  local_980 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1238:10)>
              ::_M_invoke;
  local_988 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1238:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_530,(string *)local_510,(string *)local_4f0,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_998,0));
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"--denan","");
  local_4b0[0] = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"");
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"Avoid nans when reducing","")
  ;
  local_970 = 0;
  local_978 = &local_35;
  local_960 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1244:10)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1244:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_4d0,(string *)local_4b0,(string *)local_490,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_978,0));
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"--verbose","");
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"-v","");
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"Verbose output mode","");
  local_950 = 0;
  local_958 = &local_34;
  local_940 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1250:10)>
              ::_M_invoke;
  local_948 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1250:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_470,(string *)local_450,(string *)local_430,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_958,0));
  local_410[0] = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"--debugInfo","");
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"-g","");
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d0,"Keep debug info in binaries","");
  local_930 = 0;
  local_938 = &local_33;
  local_920 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1256:10)>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1256:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_410,(string *)local_3f0,(string *)local_3d0,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_938,0));
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"--force","");
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"-f","");
  local_370[0] = local_360;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_370,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             "");
  local_910 = 0;
  local_918 = &local_32;
  local_900 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1263:10)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1263:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_3b0,(string *)local_390,(string *)local_370,
                              (int)&command + 0x18,(function *)0x0,SUB81(&local_918,0));
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"--timeout","");
  local_898[0] = local_888;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"-to","");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_330,
             "A timeout to apply to each execution of the command, in seconds (default: 2)","");
  local_8d8 = 0;
  uStack_8d0 = 0;
  local_8c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1270:10)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1270:10)>
              ::_M_manager;
  local_48 = argv;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_350,(string *)local_898,(string *)local_330,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_8d8,0));
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"--extra-flags","");
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"-ef","");
  local_858[0] = local_848;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_858,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             "");
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1280:10)>
              ::_M_invoke;
  local_8a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1280:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)local_310,(string *)local_878,(string *)local_858,
                              (int)&command + 0x18,(function *)0x1,SUB81(&local_8b8,0));
  local_838[0] = local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"INFILE","");
  local_8f0 = 0;
  local_8f8 = &local_158;
  local_8e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1287:7)>
              ::_M_invoke;
  local_8e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp:1287:7)>
              ::_M_manager;
  wasm::Options::add_positional(psVar5,(Arguments)local_838,(function *)0x1);
  if (local_8e8 != (code *)0x0) {
    (*local_8e8)(&local_8f8,&local_8f8,3);
  }
  if (local_838[0] != local_828) {
    operator_delete(local_838[0],local_828[0] + 1);
  }
  if (local_8a8 != (code *)0x0) {
    (*local_8a8)(&local_8b8,&local_8b8,3);
  }
  if (local_858[0] != local_848) {
    operator_delete(local_858[0],local_848[0] + 1);
  }
  if (local_878[0] != local_868) {
    operator_delete(local_878[0],local_868[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  psVar13 = &cmd._M_string_length;
  if (local_8c8 != (code *)0x0) {
    (*local_8c8)(&local_8d8,&local_8d8,3);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_898[0] != local_888) {
    operator_delete(local_898[0],local_888[0] + 1);
  }
  if (local_350[0] != local_340) {
    operator_delete(local_350[0],local_340[0] + 1);
  }
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,3);
  }
  if (local_370[0] != local_360) {
    operator_delete(local_370[0],local_360[0] + 1);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0],local_3a0[0] + 1);
  }
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,3);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  if (local_3f0[0] != local_3e0) {
    operator_delete(local_3f0[0],local_3e0[0] + 1);
  }
  if (local_410[0] != local_400) {
    operator_delete(local_410[0],local_400[0] + 1);
  }
  if (local_948 != (code *)0x0) {
    (*local_948)(&local_958,&local_958,3);
  }
  if (local_430[0] != local_420) {
    operator_delete(local_430[0],local_420[0] + 1);
  }
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,3);
  }
  if (local_490[0] != local_480) {
    operator_delete(local_490[0],local_480[0] + 1);
  }
  if (local_4b0[0] != local_4a0) {
    operator_delete(local_4b0[0],local_4a0[0] + 1);
  }
  if (local_4d0[0] != local_4c0) {
    operator_delete(local_4d0[0],local_4c0[0] + 1);
  }
  if (local_988 != (code *)0x0) {
    (*local_988)(&local_998,&local_998,3);
  }
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0],local_4e0[0] + 1);
  }
  if (local_510[0] != local_500) {
    operator_delete(local_510[0],local_500[0] + 1);
  }
  if (local_530[0] != local_520) {
    operator_delete(local_530[0],local_520[0] + 1);
  }
  if (local_9a8 != (code *)0x0) {
    (*local_9a8)(&local_9b8,&local_9b8,3);
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0],local_540[0] + 1);
  }
  if (local_570[0] != local_560) {
    operator_delete(local_570[0],local_560[0] + 1);
  }
  if (local_590[0] != local_580) {
    operator_delete(local_590[0],local_580[0] + 1);
  }
  if (local_9c8 != (code *)0x0) {
    (*local_9c8)(&local_9d8,&local_9d8,3);
  }
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0],local_5a0[0] + 1);
  }
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0],local_5c0[0] + 1);
  }
  if ((long *)resultOnInvalid.time != local_168) {
    operator_delete((void *)resultOnInvalid.time,local_168[0] + 1);
  }
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_98) {
    operator_delete((void *)test.field_2._8_8_,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working.field_2._8_8_ != &local_58) {
    operator_delete((void *)working.field_2._8_8_,local_58._M_allocated_capacity + 1);
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if (resultOnInvalid.output._M_dataplus._M_p != (pointer)0x0) {
    (*(code *)resultOnInvalid.output._M_dataplus._M_p)(local_1a8,local_1a8,3);
  }
  if (local_2b0 != psVar13) {
    operator_delete(local_2b0,cmd._M_string_length + 1);
  }
  if (local_b60 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_b60,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if ((long *)options._352_8_ != &local_e98) {
    operator_delete((void *)options._352_8_,local_e98 + 1);
  }
  wasm::Options::parse((int)local_1010,(char **)(local_40 & 0xffffffff));
  if (local_33 == true) {
    std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  }
  iVar3 = wasm::getTypeSystem();
  if ((iVar3 != 1) && (iVar3 = wasm::getTypeSystem(), iVar3 != 0)) {
    wasm::handle_unreachable
              ("unexpected type system",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
               ,0x512);
  }
  std::__cxx11::string::append((char *)&extraFlags_abi_cxx11_);
  if (test._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [24])"test file not provided\n");
LAB_001131c4:
    wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
  }
  if (working._M_dataplus._M_p == (pointer)0x0) {
    wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
    wasm::Fatal::operator<<
              ((Fatal *)&options.enabledFeatures,(char (*) [27])"working file not provided\n");
    goto LAB_001131c4;
  }
  if (local_31[0] == false) {
    Colors::setEnabled(false);
  }
  wasm::Path::setBinaryenBinDir((string *)&local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|wasm-reduce\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input: ",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_158,(long)input._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|test: ",7);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)WasmReduceOption.field_2._8_8_,
                      (long)test._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|working: ",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_88,(long)working._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|bin dir: ",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_5f8,(long)binDir._M_dataplus._M_p);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|extra flags: ",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,extraFlags_abi_cxx11_._M_dataplus._M_p,
                      extraFlags_abi_cxx11_._M_string_length);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&options.enabledFeatures,1);
  local_818[0] = local_808;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_818,local_158,input._M_dataplus._M_p + (long)local_158);
  local_7f8[0] = local_7e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_7f8,WasmReduceOption.field_2._8_8_,
             test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
  wasm::copy_file(local_818,local_7f8);
  if (local_7f8[0] != local_7e8) {
    operator_delete(local_7f8[0],local_7e8[0] + 1);
  }
  if (local_818[0] != local_808) {
    operator_delete(local_818[0],local_808[0] + 1);
  }
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7d8,resultOnValid.time,
             command._M_dataplus._M_p + (long)resultOnValid.time);
  ProgramResult::getFromExecution(&expected,&local_7d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|expected result:\n",0x12);
  ProgramResult::dump(&expected,(ostream *)&std::cerr);
  options.enabledFeatures.features._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)&options.enabledFeatures,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n",0x30);
  resultOnInvalid.time = (double)&local_32;
  if (((double)CONCAT44(0x45300000,(int)(timeout >> 0x20)) - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
    local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_7b8,
               "execution time is dangerously close to the timeout - you should probably increase the timeout"
               ,"");
    main::anon_class_8_1_a7eb7a0b::operator()
              ((anon_class_8_1_a7eb7a0b *)&resultOnInvalid.time,&local_7b8,&expected);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_32 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
               ,0x7c);
    std::ofstream::ofstream
              (&options.enabledFeatures,(string *)(WasmReduceOption.field_2._M_local_buf + 8),_S_bin
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&options.enabledFeatures,"waka waka\n",10);
    options.enabledFeatures.features = _VTT;
    options.disabledFeatures.features = std::ofstream::VTT_4;
    *(undefined8 *)((long)&options.enabledFeatures.features + *(long *)(_VTT + -0x18)) = _finalize;
    std::filebuf::~filebuf((filebuf *)&dst);
    std::ios_base::~ios_base(local_db0);
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_798,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    ProgramResult::ProgramResult((ProgramResult *)local_1a8,&local_798);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    bVar2 = ProgramResult::operator==((ProgramResult *)local_1a8,&expected);
    if (bVar2) {
      wasm::Module::Module((Module *)&options.enabledFeatures);
      uVar8 = (ulong)local_2b0 >> 0x10;
      cmd._M_string_length = 0;
      cmd.field_2._M_allocated_capacity = cmd.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_2b0 = (size_type *)CONCAT62((uint6)uVar8 & 0xffffffffff00,0x100);
      local_778[0] = local_768;
      cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_778,WasmReduceOption.field_2._8_8_,
                 test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      wasm::ModuleWriter::write(&local_2b0,&options.enabledFeatures,local_778);
      if (local_778[0] != local_768) {
        operator_delete(local_778[0],local_768[0] + 1);
      }
      local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_758,resultOnValid.time,
                 command._M_dataplus._M_p + (long)resultOnValid.time);
      ProgramResult::ProgramResult((ProgramResult *)((long)&input.field_2 + 8),&local_758);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_758._M_dataplus._M_p != &local_758.field_2) {
        operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
      }
      bVar2 = ProgramResult::operator==((ProgramResult *)((long)&input.field_2 + 8),&expected);
      if (bVar2) {
        wasm::Fatal::Fatal((Fatal *)local_b60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&test.field_2 + 8),
                       "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&WasmReduceOption.field_2 + 8));
        plVar7 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
        working.field_2._8_8_ = *plVar7;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)working.field_2._8_8_ == psVar13) {
          local_58._M_allocated_capacity = *psVar13;
          local_58._8_8_ = plVar7[3];
          working.field_2._8_8_ = &local_58;
        }
        else {
          local_58._M_allocated_capacity = *psVar13;
        }
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        wasm::Fatal::operator<<
                  ((Fatal *)local_b60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&working.field_2 + 8));
        std::__cxx11::string::~string((string *)(working.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
        wasm::Fatal::~Fatal((Fatal *)local_b60);
      }
      if ((size_type *)resultOnValid._0_8_ != &resultOnValid.output._M_string_length) {
        operator_delete((void *)resultOnValid._0_8_,resultOnValid.output._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmd._M_dataplus._M_p != &cmd.field_2) {
        operator_delete(cmd._M_dataplus._M_p,cmd.field_2._M_allocated_capacity + 1);
      }
      wasm::Module::~Module((Module *)&options.enabledFeatures);
    }
    if ((size_type *)resultOnInvalid._0_8_ != &resultOnInvalid.output._M_string_length) {
      operator_delete((void *)resultOnInvalid._0_8_,resultOnInvalid.output._M_string_length + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "|checking that command has expected behavior on canonicalized (read-written) binary\n"
             ,0x54);
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"wasm-opt","");
  wasm::Path::getBinaryenBinaryTool((string *)(test.field_2._M_local_buf + 8));
  plVar7 = (long *)std::__cxx11::string::append(test.field_2._M_local_buf + 8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    local_58._M_allocated_capacity = *psVar11;
    local_58._8_8_ = plVar7[3];
    working.field_2._8_8_ = &local_58;
  }
  else {
    local_58._M_allocated_capacity = *psVar11;
    working.field_2._8_8_ = (size_type *)*plVar7;
  }
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             (working.field_2._M_local_buf + 8,(ulong)local_158);
  input.field_2._8_8_ = &resultOnValid.output;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar12;
    resultOnValid.output._M_string_length = plVar7[3];
  }
  else {
    resultOnValid.output._M_dataplus._M_p = (pointer)*plVar12;
    input.field_2._8_8_ = (long *)*plVar7;
  }
  resultOnValid._0_8_ = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(input.field_2._M_local_buf + 8);
  plVar12 = plVar7 + 2;
  if ((string *)*plVar7 == (string *)plVar12) {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar12;
    resultOnInvalid.output._M_string_length = plVar7[3];
    local_1a8 = (undefined1  [8])&resultOnInvalid.output;
  }
  else {
    resultOnInvalid.output._M_dataplus._M_p = (pointer)*plVar12;
    local_1a8 = (undefined1  [8])*plVar7;
  }
  resultOnInvalid._0_8_ = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append(local_1a8,WasmReduceOption.field_2._8_8_);
  local_b60 = (undefined1  [8])&result.output;
  plVar12 = plVar7 + 2;
  if ((string *)*plVar7 == (string *)plVar12) {
    result.output._M_dataplus._M_p = (pointer)*plVar12;
    result.output._M_string_length = plVar7[3];
  }
  else {
    result.output._M_dataplus._M_p = (pointer)*plVar12;
    local_b60 = (undefined1  [8])*plVar7;
  }
  result._0_8_ = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_b60);
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_e98 = *plVar12;
    aaStack_e90[0]._0_8_ = plVar7[3];
    options._352_8_ = &local_e98;
  }
  else {
    local_e98 = *plVar12;
    options._352_8_ = (long *)*plVar7;
  }
  _dst = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&options.enabledFeatures,
                              (ulong)extraFlags_abi_cxx11_._M_dataplus._M_p);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    cmd._M_string_length = *psVar11;
    cmd.field_2._M_allocated_capacity = plVar7[3];
    local_2b0 = psVar13;
  }
  else {
    cmd._M_string_length = *psVar11;
    local_2b0 = (size_type *)*plVar7;
  }
  cmd._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((long *)options._352_8_ != &local_e98) {
    operator_delete((void *)options._352_8_,local_e98 + 1);
  }
  if (local_b60 != (undefined1  [8])&result.output) {
    operator_delete((void *)local_b60,(ulong)(result.output._M_dataplus._M_p + 1));
  }
  if (local_1a8 != (undefined1  [8])&resultOnInvalid.output) {
    operator_delete((void *)local_1a8,(ulong)(resultOnInvalid.output._M_dataplus._M_p + 1));
  }
  if ((string *)input.field_2._8_8_ != &resultOnValid.output) {
    operator_delete((void *)input.field_2._8_8_,(ulong)(resultOnValid.output._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working.field_2._8_8_ != &local_58) {
    operator_delete((void *)working.field_2._8_8_,local_58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test.field_2._8_8_ != &local_98) {
    operator_delete((void *)test.field_2._8_8_,local_98._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,(ulong)(local_1b8 + 1));
  }
  if (local_31[0] == false) {
    std::__cxx11::string::append((char *)&local_2b0);
  }
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_738,local_2b0,cmd._M_dataplus._M_p + (long)local_2b0);
  ProgramResult::ProgramResult((ProgramResult *)&options.enabledFeatures,&local_738);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if (options.enabledFeatures.features == 0) {
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6f8,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    ProgramResult::ProgramResult((ProgramResult *)local_b60,&local_6f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    bVar2 = ProgramResult::operator==((ProgramResult *)local_b60,&expected);
    if (!bVar2) {
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6d8,
                 "running command on the canonicalized module should give the same results","");
      main::anon_class_8_1_a7eb7a0b::operator()
                ((anon_class_8_1_a7eb7a0b *)&resultOnInvalid.time,&local_6d8,
                 (ProgramResult *)local_b60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
      }
    }
    local_718.field_2._M_allocated_capacity = result.output._M_string_length;
    _Var15._M_p = (pointer)result._0_8_;
    if ((size_type *)result._0_8_ == &result.output._M_string_length) goto LAB_00112714;
  }
  else {
    local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_718,"failed to read and write the binary","");
    main::anon_class_8_1_a7eb7a0b::operator()
              ((anon_class_8_1_a7eb7a0b *)&resultOnInvalid.time,&local_718,
               (ProgramResult *)&options.enabledFeatures);
    _Var15._M_p = local_718._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p == &local_718.field_2) goto LAB_00112714;
  }
  operator_delete(_Var15._M_p,local_718.field_2._M_allocated_capacity + 1);
LAB_00112714:
  if (_dst != aaStack_e90) {
    operator_delete(_dst,aaStack_e90[0]._0_8_ + 1);
  }
  if (local_2b0 != psVar13) {
    operator_delete(local_2b0,cmd._M_string_length + 1);
  }
  local_6b8[0] = local_6a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6b8,local_158,input._M_dataplus._M_p + (long)local_158);
  local_698[0] = local_688;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_698,local_88,working._M_dataplus._M_p + (long)local_88);
  wasm::copy_file(local_6b8,local_698);
  if (local_698[0] != local_688) {
    operator_delete(local_698[0],local_688[0] + 1);
  }
  if (local_6b8[0] != local_6a8) {
    operator_delete(local_6b8[0],local_6a8[0] + 1);
  }
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_678,local_88,working._M_dataplus._M_p + (long)local_88);
  uVar8 = wasm::file_size(local_678);
  if (local_678[0] != local_668) {
    operator_delete(local_678[0],local_668[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"|input size: ",0xd);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"|starting reduction!\n",0x15);
  if (local_31[0] == true) {
    uVar8 = uVar8 * 2;
  }
  else {
    uVar8 = uVar8 / 10;
  }
  uVar14 = 0;
  local_48 = (char **)((ulong)local_48 & 0xffffffff00000000);
  sVar10 = 0;
  do {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,resultOnValid.time,
               command._M_dataplus._M_p + (long)resultOnValid.time);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    binDir.field_2._8_8_ = uVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,WasmReduceOption.field_2._8_8_,
               test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f0,local_88,working._M_dataplus._M_p + (long)local_88);
    Reducer::Reducer((Reducer *)&options.enabledFeatures,&local_248,&local_228,&local_2f0,
                     local_31[0],local_35,local_34,local_33,(ToolOptions *)local_1010);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  reduce using passes...\n",0x1a);
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_208,local_88,working._M_dataplus._M_p + (long)local_88);
    lVar9 = wasm::file_size(local_208);
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
    Reducer::reduceUsingPasses((Reducer *)&options.enabledFeatures);
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d0,local_88,working._M_dataplus._M_p + (long)local_88);
    local_40 = wasm::file_size((string *)local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0],local_2c0[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  after pass reduction: ",0x19);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if (((ulong)local_48 & 1) != 0) {
      Reducer::~Reducer((Reducer *)&options.enabledFeatures);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|finished, final size: ",0x17);
      local_658[0] = local_648;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_658,local_88,working._M_dataplus._M_p + (long)local_88);
      wasm::file_size(local_658);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if (local_658[0] != local_648) {
        operator_delete(local_658[0],local_648[0] + 1);
      }
      local_638[0] = local_628;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_638,local_88,working._M_dataplus._M_p + (long)local_88);
      local_618[0] = local_608;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_618,WasmReduceOption.field_2._8_8_,
                 test._M_dataplus._M_p + WasmReduceOption.field_2._8_8_);
      wasm::copy_file(local_638,local_618);
      if (local_618[0] != local_608) {
        operator_delete(local_618[0],local_608[0] + 1);
      }
      if (local_638[0] != local_628) {
        operator_delete(local_638[0],local_628[0] + 1);
      }
      if (options.passOptions.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   options.passOptions.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&options.passOptions.arguments._M_h._M_single_bucket);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&options.passOptions.ignoreImplicitTraps);
      wasm::Options::~Options((Options *)local_1010);
      if ((size_type *)command.field_2._8_8_ != &WasmReduceOption._M_string_length) {
        operator_delete((void *)command.field_2._8_8_,WasmReduceOption._M_string_length + 1);
      }
      if ((size_type *)local_5f8 != &binDir._M_string_length) {
        operator_delete(local_5f8,binDir._M_string_length + 1);
      }
      if ((size_type *)resultOnValid.time != &command._M_string_length) {
        operator_delete((void *)resultOnValid.time,
                        CONCAT71(command._M_string_length._1_7_,(undefined1)command._M_string_length
                                ) + 1);
      }
      if (local_88 != &working._M_string_length) {
        operator_delete(local_88,CONCAT71(working._M_string_length._1_7_,
                                          (undefined1)working._M_string_length) + 1);
      }
      if ((size_type *)WasmReduceOption.field_2._8_8_ != &test._M_string_length) {
        operator_delete((void *)WasmReduceOption.field_2._8_8_,
                        CONCAT71(test._M_string_length._1_7_,(undefined1)test._M_string_length) + 1)
        ;
      }
      if (local_158 != &input._M_string_length) {
        operator_delete(local_158,
                        CONCAT71(input._M_string_length._1_7_,(undefined1)input._M_string_length) +
                        1);
      }
      return 0;
    }
    if (binDir.field_2._8_8_ - 1 < local_40) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,"|  progress has stopped, skipping to the end\n",
                          0x2d);
      iVar3 = (int)uVar8;
      if (iVar3 != 1) {
        uVar8 = (ulong)(uint)((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1);
        goto LAB_00112b36;
      }
      local_48 = (char **)CONCAT44(local_48._4_4_,(int)CONCAT71((int7)((ulong)poVar6 >> 8),1));
      uVar8 = 1;
    }
    else {
LAB_00112b36:
      local_48 = (char **)((ulong)local_48 & 0xffffffff00000000);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  pass progress: ",0x12);
    uVar14 = lVar9 - local_40;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", last destructive: ",0x14);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    local_b60[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_b60,1);
    iVar3 = (int)uVar8;
    if (uVar14 < sVar10 << 2) {
      if (iVar3 < 0xb) {
        uVar4 = (iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1;
      }
      else {
        uVar4 = (int)((uVar8 & 0xffffffff) / 3) + 1;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  progress is good, do not quickly decrease factor\n",0x34)
      ;
      uVar4 = (iVar3 * 9) / 10;
      if ((int)uVar4 < 2) {
        uVar4 = 1;
      }
    }
    if (local_40 < 5) {
      __assert_fail("newSize > 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                    ,0x5b4,"int main(int, const char **)");
    }
    iVar3 = (int)local_40;
    iVar16 = iVar3 + 3;
    if (-1 < iVar3) {
      iVar16 = iVar3;
    }
    uVar8 = (ulong)(uint)(iVar16 >> 2);
    if ((int)uVar4 <= iVar16 >> 2) {
      uVar8 = (ulong)uVar4;
    }
    while( true ) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"|  reduce destructively... (factor: ",0x24);
      iVar3 = (int)uVar8;
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      sVar10 = Reducer::reduceDestructively((Reducer *)&options.enabledFeatures,iVar3);
      if (sVar10 != 0) break;
      if (iVar3 == 1) {
        local_48 = (char **)CONCAT44(local_48._4_4_,1);
        uVar8 = 1;
        break;
      }
      iVar16 = iVar3 + 3;
      if (-1 < iVar3) {
        iVar16 = iVar3;
      }
      uVar4 = iVar16 >> 2;
      if ((int)uVar4 < 2) {
        uVar4 = 1;
      }
      uVar8 = (ulong)uVar4;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"|  destructive reduction led to size: ",0x26);
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1e8,local_88,working._M_dataplus._M_p + (long)local_88);
    wasm::file_size(local_1e8);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    local_b60[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_b60,1);
    uVar14 = local_40;
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    Reducer::~Reducer((Reducer *)&options.enabledFeatures);
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options("wasm-reduce",
                      "Reduce a wasm file to a smaller one that has the same "
                      "behavior on a given command");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }
  if (getTypeSystem() == TypeSystem::Nominal) {
    extraFlags += " --nominal";
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    extraFlags += " --hybrid";
  } else {
    WASM_UNREACHABLE("unexpected type system");
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer;
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}